

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

lbool __thiscall Minisat::Solver::search(Solver *this,int *nof_conflicts)

{
  uint64_t *puVar1;
  ulong *puVar2;
  uint *puVar3;
  uint *puVar4;
  lbool *plVar5;
  vec<Minisat::Lit> *ps;
  bool bVar6;
  byte bVar7;
  int iVar8;
  CRef cind;
  decision_heuristic dVar9;
  uint uVar10;
  uint uVar11;
  Lit LVar12;
  ulong uVar13;
  undefined7 extraout_var;
  uint64_t uVar14;
  int *piVar15;
  byte bVar16;
  ulong in_RCX;
  long lVar17;
  undefined7 uVar18;
  ulong uVar19;
  long lVar20;
  CRef CVar21;
  uint uVar22;
  int iVar23;
  double dVar24;
  float fVar25;
  ConflictData CVar26;
  CRef cr;
  int backtrack_level;
  int lbd;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  int local_ac;
  vec<Minisat::Lit> *local_a8;
  uint local_9c;
  uint local_98;
  uint local_94;
  vec<unsigned_int> *local_90;
  vec<int> *local_88;
  vec<unsigned_int> *local_80;
  vec<Minisat::Lit> *local_78;
  int *local_70;
  int *local_68;
  vec<unsigned_int> *local_60;
  ClauseAllocator *local_58;
  MyQueue<int> *local_50;
  undefined1 local_48 [16];
  
  if ((this->learnt_clause).data != (Lit *)0x0) {
    (this->learnt_clause).sz = 0;
  }
  this->starts = this->starts + 1;
  this->freeze_ls_restart_num = this->freeze_ls_restart_num + -1;
  if ((this->consumeSharedCls != (_func_void_void_ptr *)0x0) && (this->receiveClauses == true)) {
    (*this->consumeSharedCls)(this->issuer);
  }
  if ((this->allow_rephasing == true) &&
     (this->state_change_time < (long)this->solve_starts + this->starts)) {
    if (this->called_initial_sls == false) {
      call_ls(this,false);
    }
    dVar24 = ((double)CONCAT44(0x45300000,(int)(this->state_change_time >> 0x20)) -
             1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)this->state_change_time) - 4503599627370496.0) +
             this->state_change_time_inc;
    uVar13 = (ulong)dVar24;
    this->state_change_time = (long)(dVar24 - 9.223372036854776e+18) & (long)uVar13 >> 0x3f | uVar13
    ;
    this->state_change_time_inc = this->state_change_time_inc * this->state_change_time_inc_inc;
    iVar8 = rand();
    in_RCX = (ulong)(uint)((iVar8 / 100) * 100);
    if (iVar8 % 100 < 0x32) {
      info_based_rephase(this);
    }
    else {
      rand_based_rephase(this);
    }
  }
  if ((this->lcm == true) && (this->nbconfbeforesimplify * this->curSimplify <= this->conflicts)) {
    if (0 < this->verbosity) {
      printf("c schedule LCM with: nbClauses: %d, nbLearnts_core: %d, nbLearnts_tier2: %d, nbLearnts_local: %d, nbLearnts: %d\n"
             ,(ulong)(uint)(this->clauses).sz);
    }
    this->nbSimplifyAll = this->nbSimplifyAll + 1;
    bVar6 = simplifyAll(this);
    uVar13 = 1;
    if (!bVar6) goto LAB_00119a5e;
    in_RCX = this->nbconfbeforesimplify;
    this->curSimplify = this->conflicts / in_RCX + 1;
    this->nbconfbeforesimplify = (long)this->incSimplify + in_RCX;
  }
  uVar13 = CONCAT71((int7)(in_RCX >> 8),1);
  if (this->ok == true) {
    local_a8 = &this->learnt_clause;
    inprocessing(this);
    prefetchAssumptions(this);
    local_50 = &this->lbd_queue;
    local_58 = &this->ca;
    local_60 = &this->learnts_core;
    local_90 = &this->learnts_local;
    local_80 = &this->learnts_tier2;
    local_70 = &(this->trail).sz;
    local_78 = &this->conflict;
    local_88 = &this->trail_lim;
    local_b8 = (uint)CONCAT71((int7)((ulong)local_88 >> 8),1);
    CVar21 = 0xffffffff;
    local_b4 = 0;
    local_b0 = local_b8;
    local_68 = nof_conflicts;
    do {
      cind = propagate(this);
      if (cind == 0xffffffff) {
        uVar19 = (long)this->solve_starts + this->starts;
        if ((((this->state_change_time < uVar19) && ((local_b0 & 1) != 0)) &&
            (this->freeze_ls_restart_num < 1)) && (this->mediation_used == true)) {
          uVar11 = (this->trail).sz;
          uVar19 = (ulong)uVar11;
          uVar22 = (uint)((float)(this->vardata).sz * this->conflict_ratio);
          uVar13 = (ulong)uVar22;
          if (((int)uVar22 < (int)uVar11) ||
             (uVar22 = (uint)((float)this->max_trail * this->percent_ratio), uVar13 = (ulong)uVar22,
             (int)uVar22 < (int)uVar11)) {
            this->mediation_used = false;
            this->freeze_ls_restart_num = this->restarts_gap;
            bVar6 = call_ls(this,true);
            uVar19 = CONCAT71(extraout_var,bVar6);
            if (bVar6) {
              this->solved_by_ls = true;
              iVar8 = 1;
              local_b8 = 0;
              local_b0 = 0;
              goto LAB_0011963c;
            }
            local_b0 = 0;
          }
        }
        if (this->current_heuristic < CHB) {
          if ((local_b4 & 1) == 0) {
            iVar8 = (this->lbd_queue).max_sz;
            uVar13 = (ulong)iVar8;
            local_b4 = (uint)CONCAT71((int7)(uVar19 >> 8),1);
            if ((this->lbd_queue).q_sz == iVar8) {
              lVar17 = (this->lbd_queue).sum / (long)uVar13;
              uVar19 = this->conflicts_VSIDS;
              uVar13 = uVar19;
              if ((long)uVar19 < 0) {
                uVar13 = uVar19 >> 1;
              }
              bVar6 = this->global_lbd_sum / (float)uVar19 <
                      (float)(int)lVar17 * this->lbd_avg_compare_limit;
              goto LAB_001197b3;
            }
          }
          bVar6 = false;
        }
        else {
          bVar6 = *nof_conflicts < 1;
        }
LAB_001197b3:
        if ((((bVar6) || (this->asynch_interrupt != false)) ||
            ((-1 < this->conflict_budget && ((ulong)this->conflict_budget <= this->conflicts)))) ||
           (((-1 < this->propagation_budget &&
             ((ulong)this->propagation_budget <= this->propagations)) ||
            ((this->termCallback != (_func_int_void_ptr *)0x0 &&
             (iVar8 = (*this->termCallback)(this->termCallbackState), iVar8 != 0)))))) {
          (this->lbd_queue).sum = 0;
          (this->lbd_queue).q_sz = 0;
          (this->lbd_queue).ptr = 0;
          dVar24 = progressEstimate(this);
          this->progress_estimate = dVar24;
          uVar11 = getRestartLevel(this);
          if (3 < this->verbosity) {
            printf("c trigger restart with target level %d from %d\n",(ulong)uVar11,
                   (ulong)(uint)(this->trail_lim).sz);
          }
          uVar22 = (this->assumptions).sz;
          uVar10 = uVar22;
          if ((int)uVar22 < (int)uVar11) {
            uVar10 = uVar11;
          }
          if (uVar22 == 0) {
            uVar10 = uVar11;
          }
          local_b4 = 0;
          cancelUntil(this,uVar10,false);
          uVar13 = CONCAT71((int7)(uVar13 >> 8),2);
LAB_00119881:
          iVar8 = 1;
          local_b8 = (uint)uVar13;
        }
        else {
          if (((this->trail_lim).sz == 0) && (bVar6 = simplify(this), !bVar6)) {
            uVar13 = CONCAT71((int7)(uVar13 >> 8),1);
            goto LAB_00119881;
          }
          if ((this->core_size_lim != -1) && (this->core_size_lim < (this->learnts_core).sz)) {
            bVar6 = reduceDB_Core(this);
            uVar11 = (uint)((float)this->core_size_lim * this->core_size_lim_inc +
                           (float)this->core_size_lim);
            uVar13 = (ulong)uVar11;
            this->core_size_lim = uVar11;
            if (!bVar6) {
              this->core_size_lim =
                   (int)(this->core_size_lim_inc * (float)(int)uVar11 + (float)(int)uVar11);
            }
          }
          if (7000 < (this->learnts_tier2).sz) {
            reduceDB_Tier2(this);
          }
          if (this->next_L_reduce <= this->conflicts) {
            this->next_L_reduce = this->conflicts + 15000;
            reduceDB(this);
          }
          uVar11 = 0xfffffffe;
          do {
            iVar8 = (this->trail_lim).sz;
            LVar12.x = uVar11;
            if ((this->assumptions).sz <= iVar8) goto LAB_001199de;
            plVar5 = (this->assigns).data;
            LVar12.x = (this->assumptions).data[iVar8].x;
            bVar16 = plVar5[LVar12.x >> 1].value;
            uVar18 = (undefined7)((ulong)plVar5 >> 8);
            uVar13 = CONCAT71(uVar18,bVar16);
            bVar7 = (byte)LVar12.x & 1;
            if (bVar16 == bVar7) {
              local_bc = (this->trail).sz;
              vec<int>::push(local_88,(int *)&local_bc);
              iVar8 = 0;
              LVar12.x = uVar11;
            }
            else {
              bVar16 = bVar16 ^ bVar7;
              uVar13 = CONCAT71(uVar18,bVar16);
              iVar8 = 8;
              if (bVar16 == 1) {
                analyzeFinal(this,(Lit)(LVar12.x ^ 1),local_78);
                iVar8 = 1;
                uVar13 = CONCAT71((int7)(uVar13 >> 8),1);
                local_b8 = (uint)uVar13;
                LVar12.x = uVar11;
              }
            }
            uVar11 = LVar12.x;
          } while (iVar8 == 0);
          if (iVar8 == 8) {
LAB_001199de:
            if (LVar12.x == 0xfffffffe) {
              this->decisions = this->decisions + 1;
              LVar12 = pickBranchLit(this);
              if (LVar12.x == -2) {
                iVar8 = 1;
                local_b8 = 0;
                goto LAB_00119885;
              }
              this->lastDecision = LVar12.x >> 1;
            }
            local_bc = (this->trail).sz;
            vec<int>::push(local_88,(int *)&local_bc);
            uVar13 = 0xffffffff;
            uncheckedEnqueue(this,LVar12,(this->trail_lim).sz,0xffffffff);
            iVar8 = 0;
          }
        }
LAB_00119885:
        if (iVar8 == 0) goto LAB_0011963a;
      }
      else {
        if (this->current_heuristic < CHB) {
          piVar15 = &this->var_decay_timer;
          *piVar15 = *piVar15 + -1;
          if ((*piVar15 == 0) && (this->var_decay < 0.95)) {
            this->var_decay_timer = this->var_decay_timer_init;
            this->var_decay = this->var_decay + 0.01;
          }
        }
        else {
          dVar24 = this->step_size;
          if (this->min_step_size <= dVar24 && dVar24 != this->min_step_size) {
            this->step_size = dVar24 - this->step_size_dec;
          }
        }
        uVar14 = this->conflicts + 1;
        this->conflicts = uVar14;
        *nof_conflicts = *nof_conflicts + -1;
        if ((uVar14 == 100000) && ((this->learnts_core).sz < 100)) {
          this->core_lbd_cut = 5;
        }
        CVar26 = FindConflictLevel(this,cind);
        if (CVar26.nHighestLevel == 0) {
          iVar8 = 1;
          uVar13 = CONCAT71((int7)(uVar13 >> 8),1);
          local_b8 = (uint)uVar13;
          bVar6 = false;
        }
        else if (((undefined1  [12])CVar26 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
          if (local_a8->data != (Lit *)0x0) {
            (this->learnt_clause).sz = 0;
          }
          dVar9 = this->current_heuristic & ~CHB;
          if (this->conflicts < 0xc351) {
            if (dVar9 != VSIDS_DISTANCE) {
              if (this->verbosity != 0) {
                puts("c set DISTANCE to 1");
              }
              enableDISTANCEheuristic(this);
            }
          }
          else if (dVar9 == VSIDS_DISTANCE) {
            if (this->verbosity != 0) {
              puts("c set DISTANCE to 0");
            }
            disableDISTANCEheuristic(this);
          }
          if (this->current_heuristic == VSIDS_DISTANCE) {
            collectFirstUIP(this,cind);
          }
          analyze(this,cind,local_a8,&local_ac,(int *)&local_9c);
          if ((((this->confl_to_chrono < 0) || (this->confl_to_chrono <= (long)this->conflicts)) &&
              (-1 < this->chrono)) && (this->chrono <= (long)(this->trail_lim).sz - (long)local_ac))
          {
            this->chrono_backtrack = this->chrono_backtrack + 1;
            iVar8 = CVar26.nHighestLevel + -1;
            bVar6 = false;
          }
          else {
            this->non_chrono_backtrack = this->non_chrono_backtrack + 1;
            bVar6 = true;
            iVar8 = local_ac;
          }
          cancelUntil(this,iVar8,bVar6);
          uVar11 = local_9c;
          uVar22 = local_9c - 1;
          local_9c = uVar22;
          if (this->current_heuristic < CHB) {
            this->conflicts_VSIDS = this->conflicts_VSIDS + 1;
            MyQueue<int>::push(local_50,uVar22);
            uVar10 = 0x32;
            if ((int)uVar22 < 0x32) {
              uVar10 = uVar22;
            }
            this->global_lbd_sum = (float)(int)uVar10 + this->global_lbd_sum;
            local_b4 = 0;
          }
          ps = local_a8;
          shareViaCallback<Minisat::vec<Minisat::Lit>>(this,local_a8,uVar22);
          if ((this->learnt_clause).sz == 1) {
            LVar12.x = ((this->learnt_clause).data)->x;
            iVar8 = 0;
            CVar21 = 0xffffffff;
          }
          else {
            local_bc = ClauseAllocator::alloc<Minisat::vec<Minisat::Lit>>(local_58,ps,true);
            puVar3 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
            *(ulong *)(puVar3 + local_bc) =
                 *(ulong *)(puVar3 + local_bc) & 0xffffffffc000001f |
                 (ulong)((uVar22 & 0x1ffffff) << 5);
            if (this->core_lbd_cut < (int)uVar22) {
              if ((int)uVar11 < 8) {
                vec<unsigned_int>::push(local_80,&local_bc);
                uVar13 = (ulong)local_bc;
                puVar3 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
                *(ulong *)(puVar3 + uVar13) = *(ulong *)(puVar3 + uVar13) & 0xfffffffffffffffc | 2;
                goto LAB_00119435;
              }
              vec<unsigned_int>::push(local_90,&local_bc);
              puVar3 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
              puVar2 = (ulong *)(puVar3 + local_bc);
              dVar24 = this->cla_inc;
              fVar25 = (float)((double)*(float *)((long)puVar2 + (*puVar2 >> 0x22) * 4 + 8) + dVar24
                              );
              *(float *)((long)puVar2 + (*puVar2 >> 0x22) * 4 + 8) = fVar25;
              if (1e+20 < fVar25) {
                lVar17 = (long)(this->learnts_local).sz;
                if (0 < lVar17) {
                  puVar4 = local_90->data;
                  lVar20 = 0;
                  do {
                    puVar2 = (ulong *)(puVar3 + puVar4[lVar20]);
                    *(float *)((long)puVar2 + (*puVar2 >> 0x22) * 4 + 8) =
                         *(float *)((long)puVar2 + (*puVar2 >> 0x22) * 4 + 8) * 1e-20;
                    lVar20 = lVar20 + 1;
                  } while (lVar17 != lVar20);
                }
                this->cla_inc = dVar24 * 1e-20;
              }
            }
            else {
              vec<unsigned_int>::push(local_60,&local_bc);
              uVar13 = (ulong)local_bc;
              puVar2 = (ulong *)((this->ca).super_RegionAllocator<unsigned_int>.memory + uVar13);
              *puVar2 = *puVar2 | 3;
LAB_00119435:
              puVar2 = (ulong *)((this->ca).super_RegionAllocator<unsigned_int>.memory + uVar13);
              *(int *)((long)puVar2 + (*puVar2 >> 0x22) * 4 + 0xc) = (int)this->conflicts;
            }
            attachClause(this,local_bc);
            puVar1 = &(this->statistics).solveSteps;
            *puVar1 = *puVar1 + 1;
            LVar12.x = ((this->learnt_clause).data)->x;
            iVar8 = local_ac;
            CVar21 = local_bc;
          }
          uncheckedEnqueue(this,LVar12,iVar8,CVar21);
          if (this->drup_file != (FILE *)0x0) {
            binDRUP<Minisat::vec<Minisat::Lit>>(this,'a',local_a8,this->drup_file);
          }
          if (this->current_heuristic < CHB) {
            this->var_inc = (1.0 / this->var_decay) * this->var_inc;
          }
          this->cla_inc = (1.0 / this->clause_decay) * this->cla_inc;
          if ((0 < this->verbosity) &&
             (uVar13 = this->conflicts, uVar13 % (ulong)(long)this->status_every == 0)) {
            piVar15 = local_70;
            if ((this->trail_lim).sz != 0) {
              piVar15 = (this->trail_lim).data;
            }
            uVar14 = this->dec_vars;
            iVar8 = *piVar15;
            local_94 = (uint)this->max_learnts;
            local_98 = (uint)this->clauses_literals;
            uVar11 = (this->clauses).sz;
            iVar23 = (this->learnts_tier2).sz + (this->learnts_core).sz + (this->learnts_local).sz;
            dVar24 = (double)CONCAT44(0x45300000,(int)(this->learnts_literals >> 0x20)) -
                     1.9342813113834067e+25;
            local_48._8_4_ = SUB84(dVar24,0);
            local_48._0_8_ =
                 (dVar24 + ((double)CONCAT44(0x43300000,(int)this->learnts_literals) -
                           4503599627370496.0)) / (double)iVar23;
            local_48._12_4_ = (int)((ulong)dVar24 >> 0x20);
            dVar24 = progressEstimate(this);
            printf("c | %9d | %7d %8d %8d | %8d %8d %6.0f | %6.3f %% |\n",local_48._0_8_,
                   SUB84(dVar24 * 100.0,0),uVar13 & 0xffffffff,(ulong)(uint)((int)uVar14 - iVar8),
                   (ulong)uVar11,(ulong)local_98,(ulong)local_94,iVar23);
            nof_conflicts = local_68;
          }
          uVar11 = (this->trail).sz;
          uVar13 = (ulong)uVar11;
          bVar6 = true;
          iVar8 = 0;
          if (this->max_trail < (int)uVar11) {
            this->max_trail = uVar11;
            uVar13 = (ulong)(this->vardata).sz;
            if (0 < (long)uVar13) {
              uVar19 = 0;
              do {
                bVar16 = (this->assigns).data[uVar19].value;
                if ((bVar16 & 2) != 0) {
                  bVar16 = (this->polarity).data[uVar19];
                }
                (this->top_trail_soln).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar19] = bVar16 == 0;
                uVar19 = uVar19 + 1;
                iVar8 = 0;
              } while (uVar13 != uVar19);
            }
          }
        }
        else {
          uVar19 = CVar26._0_8_ >> 0x20;
          if (CVar21 != cind) {
            uVar19 = CVar26._0_8_;
          }
          bVar6 = false;
          iVar8 = (int)uVar19 + -1;
          if ((int)uVar19 < 1) {
            iVar8 = 0;
          }
          cancelUntil(this,iVar8,false);
          iVar8 = 3;
        }
        CVar21 = cind;
        if (bVar6) {
LAB_0011963a:
          iVar8 = 0;
        }
      }
LAB_0011963c:
    } while ((iVar8 == 0) || (iVar8 == 3));
    uVar13 = (ulong)local_b8;
  }
LAB_00119a5e:
  return (lbool)(uint8_t)uVar13;
}

Assistant:

lbool Solver::search(int &nof_conflicts)
{
    TRACE(std::cout << "c start search at level " << decisionLevel() << std::endl);
    assert(ok);
    int backtrack_level;
    int lbd;
    learnt_clause.clear();
    bool cached = false;
    starts++;

    // make sure that all unassigned variables are in the heap
    assert(trail.size() + order_heap->size() >= full_heap_size);

    freeze_ls_restart_num--;
    bool can_call_ls = true;

    // get clauses from parallel solving, if we want to receive
    if (consumeSharedCls != NULL && receiveClauses) consumeSharedCls(issuer);

    if (allow_rephasing && solve_starts + starts > state_change_time) {

        if (!called_initial_sls) call_ls(false);

        /* grow limit after each rephasing */
        state_change_time = state_change_time + state_change_time_inc;
        state_change_time_inc = state_change_time_inc *= state_change_time_inc_inc;

        /* actually rephase */
        if (rand() % 100 < 50)
            info_based_rephase();
        else
            rand_based_rephase();
    }


    // simplify
    //
    if (lcm && conflicts >= curSimplify * nbconfbeforesimplify) {
        TRACE(printf("c ### simplifyAll on conflict : %ld\n", conflicts);)
        if (verbosity >= 1)
            printf("c schedule LCM with: nbClauses: %d, nbLearnts_core: %d, nbLearnts_tier2: %d, nbLearnts_local: %d, "
                   "nbLearnts: %d\n",
                   clauses.size(), learnts_core.size(), learnts_tier2.size(), learnts_local.size(),
                   learnts_core.size() + learnts_tier2.size() + learnts_local.size());
        nbSimplifyAll++;
        if (!simplifyAll()) {
            return l_False;
        }
        curSimplify = (conflicts / nbconfbeforesimplify) + 1;
        nbconfbeforesimplify += incSimplify;
    }

    if (!okay()) return l_False;

    // check whether we want to do inprocessing
    inprocessing();

    prefetchAssumptions();
    CRef this_confl = CRef_Undef, prev_confl = CRef_Undef;

    for (;;) {

        TRACE(check_invariants();)

        TRACE(printf("c propagate literals on level %d with trail size %d\n", decisionLevel(), trail.size());)
        CRef confl = propagate();

        if (confl != CRef_Undef) {
            prev_confl = this_confl;
            this_confl = confl;
            // CONFLICT
            if (usesVSIDS()) {
                if (--var_decay_timer == 0 && var_decay < 0.95)
                    var_decay_timer = var_decay_timer_init, var_decay += 0.01;
            } else if (step_size > min_step_size)
                step_size -= step_size_dec;

            conflicts++;
            nof_conflicts--;
            TRACE(printf("c hit conflict %ld\n", conflicts);)
            if (conflicts == 100000 && learnts_core.size() < 100) core_lbd_cut = 5;
            ConflictData data = FindConflictLevel(confl);
            if (data.nHighestLevel == 0) return l_False;
            // assert(prev_confl != this_confl && "we should not have duplicate conflicts in a row");
            if (data.bOnlyOneLitFromHighest) { //  && prev_confl != this_confl) {
                int btLevel = (prev_confl != this_confl) ? data.nHighestLevel - 1 : data.secondHighestLevel - 1;
                btLevel = btLevel >= 0 ? btLevel : 0;
                TRACE(std::cout << "c chronological backtracking, backtrack until level " << data.nHighestLevel - 1 << std::endl;
                      for (int i = 0; i < ca[confl].size(); ++i) {
                          Lit tl = ca[confl][i];
                          std::cout << "c     " << tl << "@" << level(var(tl)) << " with reason " << reason(var(tl)) << std::endl;
                      })
                cancelUntil(btLevel, false);
                continue;
            }

            learnt_clause.clear();
            if (conflicts > 50000) {
                if (considersDISTANCE()) {
                    if (verbosity) printf("c set DISTANCE to 0\n");
                    disableDISTANCEheuristic();
                }
            } else {
                if (!considersDISTANCE()) {
                    if (verbosity) printf("c set DISTANCE to 1\n");
                    enableDISTANCEheuristic();
                }
            }
            if (current_heuristic == VSIDS_DISTANCE) collectFirstUIP(confl);

            TRACE(std::cout << "c run conflict analysis on conflict clause [" << confl << "]: " << ca[confl] << std::endl);
            analyze(confl, learnt_clause, backtrack_level, lbd);
            TRACE(std::cout << "c retrieved learnt clause " << learnt_clause << std::endl);

            // check chrono backtrack condition
            if ((confl_to_chrono < 0 || confl_to_chrono <= (int64_t)conflicts) && chrono > -1 &&
                (decisionLevel() - backtrack_level) >= chrono) {
                ++chrono_backtrack;
                TRACE(std::cout << "c chronological backtracking until level " << data.nHighestLevel - 1 << std::endl);
                assert((level(var(learnt_clause[0])) == 0 || level(var(learnt_clause[0])) > data.nHighestLevel - 1) &&
                       "learnt clause is asserting");
                cancelUntil(data.nHighestLevel - 1, false);
            } else // default behavior
            {
                ++non_chrono_backtrack;
                TRACE(std::cout << "c non-chrono backtracking until level " << backtrack_level << std::endl);
                cancelUntil(backtrack_level, true);
            }

            lbd--;
            if (usesVSIDS()) {
                cached = false;
                conflicts_VSIDS++;
                lbd_queue.push(lbd);
                global_lbd_sum += (lbd > 50 ? 50 : lbd);
            }

            // share clause with interfaces (ipasir, hordesat)
            shareViaCallback(learnt_clause, lbd);

            if (learnt_clause.size() == 1) {
                uncheckedEnqueue(learnt_clause[0], 0);
            } else {
                CRef cr = ca.alloc(learnt_clause, true);
                TRACE(std::cout << "c allocate learnt clause " << learnt_clause << " with cref= " << cr << std::endl);
                ca[cr].set_lbd(lbd);
                if (lbd <= core_lbd_cut) {
                    learnts_core.push(cr);
                    ca[cr].mark(CORE);
                    ca[cr].touched() = conflicts;
                } else if (lbd <= 6) {
                    learnts_tier2.push(cr);
                    ca[cr].mark(TIER2);
                    ca[cr].touched() = conflicts;
                } else {
                    learnts_local.push(cr);
                    claBumpActivity(ca[cr]);
                }
                attachClause(cr);
                statistics.solveSteps++;

                uncheckedEnqueue(learnt_clause[0], backtrack_level, cr);
#ifdef PRINT_OUT
                std::cout << "new " << ca[cr] << "\n";
                std::cout << "ci " << learnt_clause[0] << " l " << backtrack_level << "\n";
#endif
            }
            if (drup_file) {
#ifdef BIN_DRUP
                binDRUP('a', learnt_clause, drup_file);
#else
                for (int i = 0; i < learnt_clause.size(); i++)
                    fprintf(drup_file, "%i ", (var(learnt_clause[i]) + 1) * (-2 * sign(learnt_clause[i]) + 1));
                fprintf(drup_file, "0\n");
#endif
            }

            if (usesVSIDS()) varDecayActivity();
            claDecayActivity();

            /*if (--learntsize_adjust_cnt == 0){
                learntsize_adjust_confl *= learntsize_adjust_inc;
                learntsize_adjust_cnt    = (int)learntsize_adjust_confl;
                max_learnts             *= learntsize_inc;

            }*/

            if (verbosity >= 1 && (conflicts % status_every) == 0)
                printf("c | %9d | %7d %8d %8d | %8d %8d %6.0f | %6.3f %% |\n", (int)conflicts,
                       (int)dec_vars - (trail_lim.size() == 0 ? trail.size() : trail_lim[0]), nClauses(), (int)clauses_literals,
                       (int)max_learnts, nLearnts(), (double)learnts_literals / nLearnts(), progressEstimate() * 100);

            // the top_trail_soln should be update after each conflict
            if (trail.size() > max_trail) {
                max_trail = trail.size();

                int var_nums = nVars();
                for (int idx_i = 0; idx_i < var_nums; ++idx_i) {
                    lbool value_i = value(idx_i);
                    if (value_i == l_Undef)
                        top_trail_soln[idx_i] = !polarity[idx_i];
                    else {
                        top_trail_soln[idx_i] = value_i == l_True ? 1 : 0;
                    }
                }
            }

        } else {
            // NO CONFLICT
            if (solve_starts + starts > state_change_time) {

                if (can_call_ls && freeze_ls_restart_num < 1 && mediation_used &&
                    (trail.size() > (int)(conflict_ratio * nVars()) || trail.size() > (int)(percent_ratio * max_trail)) //&& up_time_ratio * search_start_cpu_time > ls_used_time
                ) {

                    can_call_ls = false;
                    mediation_used = false;
                    freeze_ls_restart_num = restarts_gap;
                    bool res = call_ls(true);

                    if (res) {
                        solved_by_ls = true;
                        return l_True;
                    }
                }
            }

            bool restart = false;
            if (!usesVSIDS())
                restart = nof_conflicts <= 0;
            else if (!cached) {
                restart = lbd_queue.full() && (lbd_queue.avg() * lbd_avg_compare_limit > global_lbd_sum / conflicts_VSIDS);
                cached = true;
            }
            if (restart || !withinBudget()) {
                TRACE(std::cout << "c interrupt search due to restart or budget" << std::endl);
                lbd_queue.clear();
                cached = false;
                // Reached bound on number of conflicts:
                progress_estimate = progressEstimate();

                int restartLevel = getRestartLevel();
                if (verbosity > 3)
                    printf("c trigger restart with target level %d from %d\n", restartLevel, decisionLevel());
                restartLevel = (assumptions.size() && restartLevel <= assumptions.size()) ? assumptions.size() : restartLevel;
                TRACE(std::cout << "c jump to level " << restartLevel << " for restart" << std::endl);
                cancelUntil(restartLevel);
                return l_Undef;
            }

            // Simplify the set of problem clauses:
            if (decisionLevel() == 0 && !simplify()) return l_False;

            if (core_size_lim != -1 && learnts_core.size() > core_size_lim) {
                TRACE(std::cout << "c reduce core learnt clauses" << std::endl);
                bool successful_reduced = reduceDB_Core();
                core_size_lim += core_size_lim * core_size_lim_inc;
                /* add extra penalty, if no success */
                if (!successful_reduced) core_size_lim += core_size_lim * core_size_lim_inc;
            }

            if (learnts_tier2.size() > 7000) {
                TRACE(std::cout << "c reduce tier 2 clauses" << std::endl);
                reduceDB_Tier2();
            }

            if (conflicts >= next_L_reduce) {
                next_L_reduce = conflicts + 15000;
                TRACE(std::cout << "c reduce learnt clauses" << std::endl);
                reduceDB();
            }

            Lit next = lit_Undef;
            while (decisionLevel() < assumptions.size()) {
                // Perform user provided assumption:
                Lit p = assumptions[decisionLevel()];
                if (value(p) == l_True) {
                    // Dummy decision level:
                    newDecisionLevel();
                } else if (value(p) == l_False) {
                    analyzeFinal(~p, conflict);
                    return l_False;
                } else {
                    next = p;
                    break;
                }
            }

            if (next == lit_Undef) {
                // New variable decision:
                decisions++;
                next = pickBranchLit();

                if (next == lit_Undef)
                    // Model found:
                    return l_True;

                lastDecision = var(next);
            }

            // Increase decision level and enqueue 'next'
            newDecisionLevel();
            TRACE(std::cout << "c use literal " << next << " as decision literal on level " << decisionLevel() << std::endl);
            uncheckedEnqueue(next, decisionLevel());
#ifdef PRINT_OUT
            std::cout << "d " << next << " l " << decisionLevel() << "\n";
#endif
        }
    }

    // store minimum of assumptions and current level, to forward assumptions again
    last_used_assumptions = assumptions.size() > decisionLevel() ? decisionLevel() : assumptions.size();
}